

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonFlFloatTypeValReq::_validate(JsonFlFloatTypeValReq *this,JsonVal *jsonVal)

{
  ulonglong uVar1;
  JsonObjVal *this_00;
  JsonVal *this_01;
  JsonUIntVal *this_02;
  unsigned_long_long *puVar2;
  ostream *poVar3;
  TextLocation *pTVar4;
  TextParseError *exc;
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream ss;
  unsigned_long_long len;
  string local_50;
  JsonVal *local_30;
  JsonVal *jsonLenVal;
  JsonVal *local_18;
  JsonVal *jsonVal_local;
  JsonFlFloatTypeValReq *this_local;
  
  local_18 = jsonVal;
  jsonVal_local = (JsonVal *)this;
  JsonObjValReq::_validate((JsonObjValReq *)this,jsonVal);
  this_00 = JsonVal::asObj(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"length",(allocator *)((long)&len + 7));
  this_01 = JsonObjVal::operator[](this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&len + 7));
  local_30 = this_01;
  this_02 = JsonVal::asUInt(this_01);
  puVar2 = JsonScalarVal<unsigned_long_long,_(yactfr::internal::JsonValKind)3>::operator*(this_02);
  uVar1 = *puVar2;
  if ((uVar1 != 0x20) && (uVar1 != 0x40)) {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar3 = std::operator<<((ostream *)local_1d8,"Unexpected length ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
    std::operator<<(poVar3,": yactfr only supports 32 and 64.");
    std::__cxx11::ostringstream::str();
    pTVar4 = JsonVal::loc(local_30);
    throwTextParseError(&local_1f8,*pTVar4);
  }
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonDtValReq::_validate(jsonVal);

            auto& jsonLenVal = *jsonVal.asObj()[strs::len];
            const auto len = *jsonLenVal.asUInt();

            if (len != 32 && len != 64) {
                std::ostringstream ss;

                ss << "Unexpected length " << len << ": yactfr only supports 32 and 64.";
                throwTextParseError(ss.str(), jsonLenVal.loc());
            }
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc,
                                      "Invalid fixed-length floating-point number type:",
                                      jsonVal.loc());
            throw;
        }
    }